

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock29(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t *puVar17;
  uint uVar18;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  uVar15 = puVar1[0xd];
  uVar16 = puVar1[0xe];
  puVar17 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 0x74);
  puVar17[4] = ((uint)(uVar4 << 0xc) & 0x1fffffff | (uint)(uVar3 >> 0x34)) + base;
  puVar17[5] = ((uint)(uVar4 >> 0x11) & 0x1fffffff) + base;
  puVar17[6] = ((uint)(uVar5 << 0x12) & 0x1fffffff | (uint)(uVar4 >> 0x2e)) + base;
  puVar17[7] = ((uint)(uVar5 >> 0xb) & 0x1fffffff) + base;
  *puVar17 = ((uint)uVar2 & 0x1fffffff) + base;
  puVar17[1] = ((uint)(uVar2 >> 0x1d) & 0x1fffffff) + base;
  puVar17[2] = ((uint)(uVar3 << 6) & 0x1fffffff | (uint)(uVar2 >> 0x3a)) + base;
  puVar17[3] = ((uint)(uVar3 >> 0x17) & 0x1fffffff) + base;
  puVar17[8] = ((uint)(uVar5 >> 0x28) | (uint)(uVar6 << 0x18) & 0x1fffffff) + base;
  puVar17[9] = ((uint)(uVar6 >> 5) & 0x1fffffff) + base;
  uVar18 = (uint)(uVar6 >> 0x20);
  puVar17[0xe] = ((uint)(uVar8 >> 0x16) & 0x1fffffff) + base;
  puVar17[0xf] = ((uint)(uVar9 << 0xd) & 0x1fffffff | (uint)(uVar8 >> 0x33)) + base;
  puVar17[0x10] = ((uint)(uVar9 >> 0x10) & 0x1fffffff) + base;
  puVar17[0x11] = ((uint)(uVar10 << 0x13) & 0x1fffffff | (uint)(uVar9 >> 0x2d)) + base;
  puVar17[10] = (uVar18 >> 2 & 0x1fffffff) + base;
  puVar17[0xb] = ((uint)(uVar7 << 1) & 0x1fffffff | uVar18 >> 0x1f) + base;
  puVar17[0xc] = ((uint)(uVar7 >> 0x1c) & 0x1fffffff) + base;
  puVar17[0xd] = ((uint)(uVar8 << 7) & 0x1fffffff | (uint)(uVar7 >> 0x39)) + base;
  puVar17[0x12] = ((uint)(uVar10 >> 10) & 0x1fffffff) + base;
  puVar17[0x13] = ((uint)(uVar11 << 0x19) & 0x1fffffff | (uint)(uVar10 >> 0x27)) + base;
  puVar17[0x14] = ((uint)(uVar11 >> 4) & 0x1fffffff) + base;
  uVar18 = (uint)(uVar11 >> 0x20);
  puVar17[0x19] = ((uint)(uVar13 >> 0x15) & 0x1fffffff) + base;
  puVar17[0x1a] = ((uint)(uVar14 << 0xe) & 0x1fffffff | (uint)(uVar13 >> 0x32)) + base;
  puVar17[0x1b] = ((uint)(uVar14 >> 0xf) & 0x1fffffff) + base;
  puVar17[0x1c] = ((uint)(uVar15 << 0x14) & 0x1fffffff | (uint)(uVar14 >> 0x2c)) + base;
  puVar17[0x15] = (uVar18 >> 1 & 0x1fffffff) + base;
  puVar17[0x16] = ((uint)(uVar12 << 2) & 0x1fffffff | uVar18 >> 0x1e) + base;
  puVar17[0x17] = ((uint)(uVar12 >> 0x1b) & 0x1fffffff) + base;
  puVar17[0x18] = ((uint)(uVar13 << 8) & 0x1fffffff | (uint)(byte)(uVar12 >> 0x38)) + base;
  puVar17[0x1d] = ((uint)(uVar15 >> 9) & 0x1fffffff) + base;
  puVar17[0x1e] = ((uint)(uVar16 << 0x1a) & 0x1fffffff | (uint)(uVar15 >> 0x26)) + base;
  puVar17[0x1f] = ((uint)(uVar16 >> 3) & 0x1fffffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock29(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(536870911);
  /* we are going to access  15 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  uint64_t w14 = pw64[14];
  *pw += 116; /* we used up 116 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 29) & mask);
  out[2] = base + (uint32_t)(((w0 >> 58) | (w1 << 6)) & mask);
  out[3] = base + (uint32_t)((w1 >> 23) & mask);
  out[4] = base + (uint32_t)(((w1 >> 52) | (w2 << 12)) & mask);
  out[5] = base + (uint32_t)((w2 >> 17) & mask);
  out[6] = base + (uint32_t)(((w2 >> 46) | (w3 << 18)) & mask);
  out[7] = base + (uint32_t)((w3 >> 11) & mask);
  out[8] = base + (uint32_t)(((w3 >> 40) | (w4 << 24)) & mask);
  out[9] = base + (uint32_t)((w4 >> 5) & mask);
  out[10] = base + (uint32_t)((w4 >> 34) & mask);
  out[11] = base + (uint32_t)(((w4 >> 63) | (w5 << 1)) & mask);
  out[12] = base + (uint32_t)((w5 >> 28) & mask);
  out[13] = base + (uint32_t)(((w5 >> 57) | (w6 << 7)) & mask);
  out[14] = base + (uint32_t)((w6 >> 22) & mask);
  out[15] = base + (uint32_t)(((w6 >> 51) | (w7 << 13)) & mask);
  out[16] = base + (uint32_t)((w7 >> 16) & mask);
  out[17] = base + (uint32_t)(((w7 >> 45) | (w8 << 19)) & mask);
  out[18] = base + (uint32_t)((w8 >> 10) & mask);
  out[19] = base + (uint32_t)(((w8 >> 39) | (w9 << 25)) & mask);
  out[20] = base + (uint32_t)((w9 >> 4) & mask);
  out[21] = base + (uint32_t)((w9 >> 33) & mask);
  out[22] = base + (uint32_t)(((w9 >> 62) | (w10 << 2)) & mask);
  out[23] = base + (uint32_t)((w10 >> 27) & mask);
  out[24] = base + (uint32_t)(((w10 >> 56) | (w11 << 8)) & mask);
  out[25] = base + (uint32_t)((w11 >> 21) & mask);
  out[26] = base + (uint32_t)(((w11 >> 50) | (w12 << 14)) & mask);
  out[27] = base + (uint32_t)((w12 >> 15) & mask);
  out[28] = base + (uint32_t)(((w12 >> 44) | (w13 << 20)) & mask);
  out[29] = base + (uint32_t)((w13 >> 9) & mask);
  out[30] = base + (uint32_t)(((w13 >> 38) | (w14 << 26)) & mask);
  out[31] = base + (uint32_t)((w14 >> 3) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}